

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_symlink.c
# Opt level: O2

void test_write_disk_symlink(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *a;
  archive_entry *paVar3;
  ssize_t sVar4;
  
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    a = archive_write_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L',',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                     (void *)0x0);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'3',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link1a");
    archive_entry_set_mode(paVar3,0x81ed);
    archive_entry_set_size(paVar3,0x1b);
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'7',0,"0",(long)iVar2,"archive_write_header(ad, ae)",a);
    sVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'9',0x1b,"sizeof(data)",sVar4,"archive_write_data(ad, data, sizeof(data))"
                        ,(void *)0x0);
    iVar2 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L':',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'>',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link1b");
    archive_entry_set_mode(paVar3,0xa1a2);
    archive_entry_set_size(paVar3,0);
    archive_entry_copy_symlink(paVar3,"link1a");
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'C',0,"0",(long)iVar2,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar2) {
      iVar2 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                          ,L'E',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'N',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link2b");
    archive_entry_set_mode(paVar3,0xa1a2);
    archive_entry_unset_size(paVar3);
    archive_entry_copy_symlink(paVar3,"link2a");
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'S',0,"0",(long)iVar2,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar2) {
      sVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                          ,L'V',-0x14,"ARCHIVE_WARN",sVar4,
                          "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
      iVar2 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                          ,L'W',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'\\',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link2a");
    archive_entry_set_mode(paVar3,0x81ed);
    archive_entry_set_size(paVar3,0x1b);
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'`',0,"0",(long)iVar2,"archive_write_header(ad, ae)",a);
    sVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'b',0x1b,"sizeof(data)",sVar4,"archive_write_data(ad, data, sizeof(data))"
                        ,(void *)0x0);
    iVar2 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'c',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    archive_entry_free(paVar3);
    iVar2 = archive_write_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(ad)",(void *)0x0);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'k',"link1a",L'\xffffffff');
    assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'l',"link1a",0x1b);
    assertion_file_nlinks
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
               ,L'm',"link1a",L'\x01');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
               ,L'n',"link1b","link1a");
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                     ,L'q',"link2a",L'\xffffffff');
    assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                        ,L'r',"link2a",0x1b);
    assertion_file_nlinks
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
               ,L's',"link2a",L'\x01');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
               ,L't',"link2b","link2a");
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                 ,L'\'');
  test_skipping("Symlinks not supported");
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_symlink)
{
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct archive_entry *ae;
	int r;

	if (!canSymlink()) {
		skipping("Symlinks not supported");
		return;
	}

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * First, create a regular file then a symlink to that file.
	 */

	/* Regular file: link1a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1a");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Symbolic Link: link1b -> link1a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1b");
	archive_entry_set_mode(ae, AE_IFLNK | 0642);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_symlink(ae, "link1a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN)
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/*
	 * We should be able to do this in the other order as well,
	 * of course.
	 */

	/* Symbolic link: link2b -> link2a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2b");
	archive_entry_set_mode(ae, AE_IFLNK | 0642);
	archive_entry_unset_size(ae);
	archive_entry_copy_symlink(ae, "link2a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/* File: link2a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2a");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	assertEqualInt(ARCHIVE_OK, archive_write_free(ad));

	/* Test the entries on disk. */

	/* Test #1 */
	assertIsReg("link1a", -1);
	assertFileSize("link1a", sizeof(data));
	assertFileNLinks("link1a", 1);
	assertIsSymlink("link1b", "link1a");

	/* Test #2: Should produce identical results to test #1 */
	assertIsReg("link2a", -1);
	assertFileSize("link2a", sizeof(data));
	assertFileNLinks("link2a", 1);
	assertIsSymlink("link2b", "link2a");
}